

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O0

void __thiscall
xray_re::se_smart_terrain::state_read(se_smart_terrain *this,xr_packet *packet,uint16_t size)

{
  bool bVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  int iVar4;
  char *pcVar5;
  uint16_t size_local;
  xr_packet *packet_local;
  se_smart_terrain *this_local;
  
  cse_alife_smart_zone::state_read((cse_alife_smart_zone *)this,packet,size);
  if (*(ushort *)&this->field_0x28 < 0x80) {
    if (*(ushort *)&this->field_0x28 < 0x7a) {
      if (*(short *)&this->field_0x28 == 0x76) {
        r_ctime(packet);
        r_ctime(packet);
        bVar1 = xr_packet::r_bool(packet);
        if (bVar1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                        ,0x1fb,
                        "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)")
          ;
        }
      }
      else if ((*(short *)&this->field_0x28 != 0x68) && (*(short *)&this->field_0x28 != 0x75)) {
        if (*(short *)&this->field_0x28 != 0x65) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                        ,0x207,
                        "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)")
          ;
        }
        xr_packet::r_u8(packet);
        r_ctime(packet);
        r_ctime(packet);
        uVar2 = xr_packet::r_u8(packet);
        if (uVar2 != '\0') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                        ,0x205,
                        "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)")
          ;
        }
      }
    }
    else {
      if (0x7c < *(ushort *)&this->field_0x28) {
        __assert_fail("m_version <= CSE_VERSION_CS",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x1d0,
                      "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
      }
      cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"se_smart_terrain");
      cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"CCombat_manager");
      bVar1 = xr_packet::r_bool(packet);
      if (bVar1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x1d7,
                      "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
      }
      pcVar5 = xr_packet::skip_sz(packet);
      iVar4 = strcmp(pcVar5,"nil");
      if (iVar4 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x1d9,
                      "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
      }
      uVar3 = xr_packet::r_u16(packet);
      if (uVar3 != 0xffff) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x1db,
                      "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
      }
      pcVar5 = xr_packet::skip_sz(packet);
      iVar4 = strcmp(pcVar5,"nil");
      if (iVar4 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x1dd,
                      "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
      }
      bVar1 = xr_packet::r_bool(packet);
      if (bVar1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x1df,
                      "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
      }
      uVar2 = xr_packet::r_u8(packet);
      if (uVar2 != '\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x1e1,
                      "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
      }
      bVar1 = xr_packet::r_bool(packet);
      if (bVar1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x1e3,
                      "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
      }
      uVar2 = xr_packet::r_u8(packet);
      if (uVar2 != '\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x1e5,
                      "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
      }
      cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"CCover_manager");
      bVar1 = xr_packet::r_bool(packet);
      if (bVar1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x1ea,
                      "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
      }
      uVar2 = xr_packet::r_u8(packet);
      if (uVar2 != '\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x1ec,
                      "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
      }
      cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"CCover_manager");
      cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"CCombat_manager");
      uVar2 = xr_packet::r_u8(packet);
      if (uVar2 != '\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x1f2,
                      "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
      }
      uVar2 = xr_packet::r_u8(packet);
      if (uVar2 != '\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,500,
                      "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
      }
      cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"se_smart_terrain");
    }
  }
  else {
    if (0x80 < *(ushort *)&this->field_0x28) {
      __assert_fail("m_version <= CSE_VERSION_COP",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1be,
                    "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"se_smart_terrain");
    xr_packet::r_u8(packet,&this->arriving_npc_count);
    xr_packet::r_u8(packet,&this->npc_info_count);
    xr_packet::r_u8(packet,&this->dead_time_count);
    xr_packet::r_u8(packet,&this->base_on_actor_control_present);
    if ((this->base_on_actor_control_present != '\x01') &&
       (xr_packet::r_u8(packet,&this->is_respawn_point), this->is_respawn_point != '\x01')) {
      xr_packet::r_u8(packet,&this->population);
      cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"se_smart_terrain");
    }
  }
  return;
}

Assistant:

void se_smart_terrain::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_smart_zone::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x80) {
		xr_assert(m_version <= CSE_VERSION_COP);

		set_save_marker(packet, SM_LOAD, false, "se_smart_terrain");

    	packet.r_u8(arriving_npc_count);
    	packet.r_u8(npc_info_count);
    	packet.r_u8(dead_time_count);
    	packet.r_u8(base_on_actor_control_present);
		if (base_on_actor_control_present == 1)
			return;
    	packet.r_u8(is_respawn_point);
		if (is_respawn_point == 1)
			return;
    	packet.r_u8(population);
	  
	  	set_save_marker(packet, SM_LOAD, true, "se_smart_terrain");
	}
	else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);

		set_save_marker(packet, SM_LOAD, false, "se_smart_terrain");

		// CCombat_manager
		set_save_marker(packet, SM_LOAD, false, "CCombat_manager");
		if (packet.r_bool())			// actor_defense_come
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// combat_quest
			xr_not_implemented();
		if (packet.r_u16() != 0xffff)		// task
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// see_actor_enemy
			xr_not_implemented();
		if (packet.r_bool())			// see_actor_enemy_time presence
			xr_not_implemented();
		if (packet.r_u8())			// #squads
			xr_not_implemented();
		if (packet.r_bool())			// force_online
			xr_not_implemented();
		if (packet.r_u8())			// #force_online_squads
			xr_not_implemented();

		// CCover_manager
		set_save_marker(packet, SM_LOAD, false, "CCover_manager");
		if (packet.r_bool())			// is_valid
			xr_not_implemented();
		if (packet.r_u8())			// #cover_table
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, true, "CCover_manager");
		set_save_marker(packet, SM_LOAD, true, "CCombat_manager");

		// actual se_smart_terrain
		if (packet.r_u8())		// #npc_info
			xr_not_implemented();
		if (packet.r_u8())		// #dead_time
			xr_not_implemented();

		set_save_marker(packet, SM_LOAD, true, "se_smart_terrain");
	} else if (m_version == CSE_VERSION_SOC) {
		r_ctime(packet);		// duration_end
		r_ctime(packet);		// idle_end
		if (packet.r_bool())		// gulag_working
			xr_not_implemented();
	} else if (m_version == CSE_VERSION_2232) {
		//script save nothing
	} else if (m_version == CSE_VERSION_2571) {
		//script save nothing
	} else if (m_version == CSE_VERSION_2215) {
		packet.r_u8();			// gulagN
		r_ctime(packet);		// duration_end
		r_ctime(packet);		// idle_end
		if (packet.r_u8())		// #npcs
			xr_not_implemented();
	} else {
		xr_not_implemented();
	}
}